

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O2

bool correctActionContext(ShortcutContext context,QAction *a,QWidget *active_window)

{
  QWidget *w;
  QObject **ppQVar1;
  char cVar2;
  bool bVar3;
  QMenu *this;
  QAction *a_00;
  QGraphicsWidget *w_00;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QArrayDataPointer<QObject_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (active_window == (QWidget *)0x0) {
    bVar6 = false;
  }
  else {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    QAction::associatedObjects();
    ppQVar1 = local_58.ptr;
    lVar5 = local_58.size << 3;
    for (lVar4 = 0; bVar6 = lVar5 != lVar4, bVar6; lVar4 = lVar4 + 8) {
      w = *(QWidget **)((long)ppQVar1 + lVar4);
      this = QtPrivate::qobject_cast_helper<QMenu*,QObject>(&w->super_QObject);
      if (this == (QMenu *)0x0) {
        if ((w == (QWidget *)0x0) || ((*(byte *)(*(long *)&w->field_0x8 + 0x30) & 1) == 0)) {
          w_00 = QtPrivate::qobject_cast_helper<QGraphicsWidget*,QObject>(&w->super_QObject);
          if (w_00 == (QGraphicsWidget *)0x0) goto LAB_0037f3a5;
          bVar3 = correctGraphicsWidgetContext(context,w_00,active_window);
        }
        else {
          bVar3 = correctWidgetContext(context,w,active_window);
        }
LAB_0037f3a1:
        if (bVar3 != false) break;
      }
      else {
        a_00 = QMenu::menuAction(this);
        cVar2 = QAction::isVisible();
        if (cVar2 != '\0') {
          cVar2 = QAction::isEnabled();
          if (cVar2 != '\0') {
            bVar3 = correctActionContext(context,a_00,active_window);
            goto LAB_0037f3a1;
          }
        }
      }
LAB_0037f3a5:
    }
    QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

static bool correctActionContext(Qt::ShortcutContext context, QAction *a, QWidget *active_window)
{
    if (!active_window)
        return false;

    const QObjectList associatedObjects = a->associatedObjects();
#if defined(DEBUG_QSHORTCUTMAP)
    if (associatedObjects.isEmpty())
        qDebug() << a << "not connected to any widgets; won't trigger";
#endif
    for (auto object : associatedObjects) {
#if QT_CONFIG(menu)
        if (auto menu = qobject_cast<QMenu *>(object)) {
#ifdef Q_OS_DARWIN
            // On Mac, menu item shortcuts are processed before reaching any window.
            // That means that if a menu action shortcut has not been already processed
            // (and reaches this point), then the menu item itself has been disabled.
            // This occurs at the QPA level on Mac, where we disable all the Cocoa menus
            // when showing a modal window. (Notice that only the QPA menu is disabled,
            // not the QMenu.) Since we can also reach this code by climbing the menu
            // hierarchy (see below), or when the shortcut is not a key-equivalent, we
            // need to check whether the QPA menu is actually disabled.
            // When there is no QPA menu, there will be no QCocoaMenuDelegate checking
            // for the actual shortcuts. We can then fallback to our own logic.
            QPlatformMenu *pm = menu->platformMenu();
            if (pm && !pm->isEnabled())
                continue;
#endif
            QAction *a = menu->menuAction();
            if (a->isVisible() && a->isEnabled() && correctActionContext(context, a, active_window))
                return true;
        } else
#endif
        if (auto widget = qobject_cast<QWidget*>(object)) {
            if (correctWidgetContext(context, widget, active_window))
                return true;
        }
#if QT_CONFIG(graphicsview)
        else if (auto graphicsWidget = qobject_cast<QGraphicsWidget*>(object)) {
            if (correctGraphicsWidgetContext(context, graphicsWidget, active_window))
                return true;
        }
#endif
    }

    return false;
}